

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.hpp
# Opt level: O2

idx_t __thiscall duckdb::RadixPartitionedColumnData::BufferSize(RadixPartitionedColumnData *this)

{
  idx_t iVar1;
  
  iVar1 = 0x80;
  if (this->radix_bits - 1 < 6) {
    iVar1 = *(idx_t *)(&DAT_0200bfe8 + this->radix_bits * 8);
  }
  return iVar1;
}

Assistant:

idx_t BufferSize() const override {
		switch (radix_bits) {
		case 1:
		case 2:
		case 3:
		case 4:
			return GetBufferSize(1 << 1);
		case 5:
			return GetBufferSize(1 << 2);
		case 6:
			return GetBufferSize(1 << 3);
		default:
			return GetBufferSize(1 << 4);
		}
	}